

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  test_var_type tVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *pTVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  string uniform_use;
  string uniform_definition;
  GLint buffer_data [16];
  GLuint buffer_object_id;
  string local_d8;
  string local_b8;
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_50;
  long lVar4;
  
  iVar2 = (*((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
             super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.context_id)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  lVar8 = 0;
  while( true ) {
    if (supported_variable_types_map._16_8_ == 0) break;
    tVar1 = test_shader_compilation::var_types_set_es[lVar8];
    lVar7 = 0x21e5b78;
    lVar6 = supported_variable_types_map._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar6 + 0x20)) {
        lVar7 = lVar6;
      }
      lVar6 = *(long *)(lVar6 + 0x10 + (ulong)(*(int *)(lVar6 + 0x20) < (int)tVar1) * 8);
    } while (lVar6 != 0);
    if ((lVar7 == 0x21e5b78) || ((int)tVar1 < *(int *)(lVar7 + 0x20))) break;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::_M_append((char *)&local_b8,*(ulong *)(lVar7 + 0x28));
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)local_d8._M_string_length,0x1ad3fdc)
    ;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::prepare_fragment_shader
              (&local_98,&this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>,
               tested_shader_type,&local_b8,&local_d8);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>::prepare_vertex_shader
              (&local_50,&this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>,
               tested_shader_type,&local_b8,&local_d8);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[9])(this,&local_50,&local_98,0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                      local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_) !=
        &local_98.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_),
                      local_98.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p._0_4_ = 0;
    (**(code **)(lVar4 + 0x1680))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b55);
    iVar2 = (**(code **)(lVar4 + 0xb38))
                      ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
                       super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id,
                       "uniform_block_name");
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetUniformBlockIndex() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,7000);
    if (iVar2 == -1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Uniform block not found or is considered as not active.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1b5c);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x6c8))(1,&local_50);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b60);
    (**(code **)(lVar4 + 0x40))(0x8a11,local_50._M_dataplus._M_p._0_4_);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b63);
    if (lVar8 == 2) {
      local_68 = 0xd0000000c;
      uStack_60 = 0xf0000000e;
      local_78 = 0x900000008;
      uStack_70 = 0xb0000000a;
      local_98.field_2._M_allocated_capacity = 0x500000004;
      local_98.field_2._8_8_ = 0x700000006;
      local_98._M_dataplus._M_p._0_4_ = 0;
      local_98._M_dataplus._M_p._4_4_ = 1;
      local_98._M_string_length._0_4_ = 2;
      local_98._M_string_length._4_4_ = 3;
      (**(code **)(lVar4 + 0x150))(0x8a11,0x40,&local_98,0x88e4);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b80);
    }
    else if (lVar8 == 1) {
      local_68 = 0xd0000000c;
      uStack_60 = 0xf0000000e;
      local_78 = 0x900000008;
      uStack_70 = 0xb0000000a;
      local_98.field_2._M_allocated_capacity = 0x500000004;
      local_98.field_2._8_8_ = 0x700000006;
      local_98._M_dataplus._M_p._0_4_ = 0;
      local_98._M_dataplus._M_p._4_4_ = 1;
      local_98._M_string_length._0_4_ = 2;
      local_98._M_string_length._4_4_ = 3;
      (**(code **)(lVar4 + 0x150))(0x8a11,0x40,&local_98,0x88e4);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b77);
    }
    else {
      local_68 = 0x4150000041400000;
      uStack_60 = 0x4170000041600000;
      local_78 = 0x4110000041000000;
      uStack_70 = 0x4130000041200000;
      local_98.field_2._M_allocated_capacity = 0x40a0000040800000;
      local_98.field_2._8_8_ = 0x40e0000040c00000;
      local_98._M_dataplus._M_p._0_4_ = 0;
      local_98._M_dataplus._M_p._4_4_ = 0x3f800000;
      local_98._M_string_length._0_4_ = 0x40000000;
      local_98._M_string_length._4_4_ = 0x40400000;
      (**(code **)(lVar4 + 0x150))(0x8a11,0x40,&local_98,0x88e4);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1b6d);
    }
    (**(code **)(lVar4 + 0x15d0))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.program_object_id,iVar2,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUniformBlockBinding() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b97);
    (**(code **)(lVar4 + 0x48))(0x8a11,0,local_50._M_dataplus._M_p._0_4_);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBufferBase() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b9a);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this);
    }
    else {
      execute_draw_test(this,tested_shader_type);
    }
    (**(code **)(lVar4 + 0x438))(1,&local_50);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::ES>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 3) {
      return;
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1bab);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniformBuffers2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glw::Functions&		gl			  = this->context_id.getRenderContext().getFunctions();
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float / int / uint values. */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string uniform_definition;
			std::string uniform_use;

			uniform_definition += "layout (std140) uniform uniform_block_name\n"
								  "{\n";
			uniform_definition += "    ";
			uniform_definition += var_iterator->second.type;
			uniform_definition += " my_uniform_1[1][1][1][1];\n"
								  "};\n";

			uniform_use = "    float result = float(my_uniform_1[0][0][0][0]);\n";

			if (API::USE_ALL_SHADER_STAGES)
			{
				const std::string& compute_shader_source =
					this->prepare_compute_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& geometry_shader_source =
					this->prepare_geometry_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_ctrl_shader_source =
					this->prepare_tess_ctrl_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_eval_shader_source =
					this->prepare_tess_eval_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				switch (tested_shader_type)
				{
				case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
					break;

				case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
												geometry_shader_source, fragment_shader_source, compute_shader_source,
												false, false);
					break;

				default:
					TCU_FAIL("Invalid enum");
					break;
				}
			}
			else
			{
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			}

			glw::GLuint buffer_object_id	   = 0;
			glw::GLint  my_uniform_block_index = GL_INVALID_INDEX;

			gl.useProgram(this->program_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

			my_uniform_block_index = gl.getUniformBlockIndex(this->program_object_id, "uniform_block_name");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex() failed.");

			if ((unsigned)my_uniform_block_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Uniform block not found or is considered as not active.");
			}

			gl.genBuffers(1, &buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

			switch (var_type_index)
			{
			case 0: //float type of uniform is considered
			{
				glw::GLfloat buffer_data[] = { 0.0f, 1.0f, 2.0f,  3.0f,  4.0f,  5.0f,  6.0f,  7.0f,
											   8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* float case */
			case 1: //int type of uniform is considered
			{

				glw::GLint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* int case */
			case 2: //uint type of uniform is considered
			{
				glw::GLuint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* uint case */
			case 3: //double type of uniform is considered
			{
				glw::GLdouble buffer_data[] = { 0.0, 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,
												8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			} /* double case */
			default:
			{
				TCU_FAIL("Invalid variable-type index.");

				break;
			}
			} /* switch (var_type_index) */

			gl.uniformBlockBinding(this->program_object_id, my_uniform_block_index, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformBlockBinding() failed.");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

			if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
			{
				execute_draw_test(tested_shader_type);
			}
			else
			{
				execute_dispatch_test();
			}

			/* Deallocate any resources used. */
			gl.deleteBuffers(1, &buffer_object_id);
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}